

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall fasttext::Model::buildTree(Model *this,vector<long,_std::allocator<long>_> *counts)

{
  vector<fasttext::Node,_std::allocator<fasttext::Node>_> *this_00;
  uint uVar1;
  pointer pNVar2;
  pointer plVar3;
  pointer pNVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  vector<bool,_std::allocator<bool>_> *pvVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [32];
  undefined1 in_ZMM3 [64];
  vector<int,_std::allocator<int>_> path;
  int local_8c;
  undefined1 local_88 [16];
  _Bit_type *local_78;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  auVar27 = in_ZMM3._0_32_;
  this_00 = &this->tree;
  std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::resize
            (this_00,(long)this->osz_ * 2 - 1);
  uVar1 = this->osz_;
  lVar10 = (long)(int)uVar1;
  iVar6 = uVar1 * 2 + -1;
  if (0 < lVar10) {
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpbroadcastq_avx512f(ZEXT816(1000000000000000));
    auVar22 = vpbroadcastq_avx512f(ZEXT816(8));
    pNVar2 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    auVar27 = vpcmpeqd_avx2(auVar27,auVar27);
    iVar12 = 1;
    if (1 < iVar6) {
      iVar12 = iVar6;
    }
    uVar13 = (ulong)(iVar12 + 7U & 0xfffffff8);
    auVar23 = vpbroadcastq_avx512f();
    auVar24 = vpbroadcastq_avx512f();
    do {
      uVar5 = vpcmpuq_avx512f(auVar20,auVar23,2);
      auVar25 = vpsllq_avx512f(auVar20,5);
      auVar26 = vpaddq_avx512f(auVar24,auVar25);
      vpscatterqd_avx512f(ZEXT832(pNVar2) + auVar25._0_32_,uVar5,auVar27);
      vpscatterqd_avx512f(ZEXT832(4) + auVar26._0_32_,uVar5,auVar27);
      vpscatterqd_avx512f(ZEXT832(8) + auVar26._0_32_,uVar5,auVar27);
      vpscatterqq_avx512f(ZEXT864(0x10) + auVar26,uVar5,auVar21);
      if ((uVar5 & 1) != 0) {
        *(undefined1 *)(auVar26._0_8_ + 0x18) = 0;
      }
      if ((uVar5 & 2) != 0) {
        lVar15 = vpextrq_avx(auVar26._0_16_,1);
        *(undefined1 *)(lVar15 + 0x18) = 0;
      }
      if ((uVar5 & 4) != 0) {
        *(undefined1 *)(auVar26._16_8_ + 0x18) = 0;
      }
      if ((uVar5 & 8) != 0) {
        lVar15 = vpextrq_avx(auVar26._16_16_,1);
        *(undefined1 *)(lVar15 + 0x18) = 0;
      }
      auVar19 = vextracti32x4_avx512f(auVar26,2);
      if ((uVar5 & 0x10) != 0) {
        *(undefined1 *)(auVar19._0_8_ + 0x18) = 0;
      }
      if ((uVar5 & 0x20) != 0) {
        lVar15 = vpextrq_avx(auVar19,1);
        *(undefined1 *)(lVar15 + 0x18) = 0;
      }
      auVar19 = vextracti32x4_avx512f(auVar26,3);
      if ((uVar5 & 0x40) != 0) {
        *(undefined1 *)(auVar19._0_8_ + 0x18) = 0;
      }
      if ((uVar5 & 0x80) != 0) {
        lVar15 = vpextrq_avx(auVar19,1);
        *(undefined1 *)(lVar15 + 0x18) = 0;
      }
      auVar20 = vpaddq_avx512f(auVar20,auVar22);
      uVar13 = uVar13 - 8;
    } while (uVar13 != 0);
    if (0 < (int)uVar1) {
      plVar3 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pNVar2 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar15 = 0;
      do {
        *(undefined8 *)((long)&pNVar2->count + lVar15 * 4) = *(undefined8 *)((long)plVar3 + lVar15);
        lVar15 = lVar15 + 8;
      } while (lVar10 * 8 - lVar15 != 0);
    }
  }
  if ((int)uVar1 < iVar6) {
    pNVar2 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = uVar1 - 1;
    uVar16 = uVar1;
    do {
      pNVar4 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pvVar18 = &local_58;
      bVar9 = true;
      do {
        bVar11 = bVar9;
        if (((int)uVar14 < 0) || (pNVar4[(int)uVar16].count <= pNVar4[uVar14].count)) {
          uVar7 = uVar14;
          uVar8 = uVar16 + 1;
          uVar17 = uVar16;
        }
        else {
          uVar7 = uVar14 - 1;
          uVar8 = uVar16;
          uVar17 = uVar14;
        }
        uVar16 = uVar8;
        uVar14 = uVar7;
        *(uint *)&(pvVar18->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = uVar17;
        pvVar18 = (vector<bool,_std::allocator<bool>_> *)local_88;
        bVar9 = false;
      } while (bVar11);
      pNVar2[lVar10].left =
           (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p;
      lVar15 = (long)(int)local_88._0_4_;
      pNVar2[lVar10].right = local_88._0_4_;
      pNVar2[lVar10].count =
           pNVar2[lVar15].count +
           pNVar2[(int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].count;
      pNVar2[(int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].parent =
           (int32_t)lVar10;
      pNVar2[lVar15].parent = (int32_t)lVar10;
      lVar10 = lVar10 + 1;
      pNVar2[lVar15].binary = true;
    } while (lVar10 != iVar6);
  }
  if (0 < (int)uVar1) {
    local_60 = &this->paths;
    local_68 = &this->codes;
    lVar10 = 0;
    do {
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_78 = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      local_88._0_8_ = (_Bit_type *)0x0;
      local_88._8_4_ = 0;
      local_88._12_4_ = 0;
      iVar6 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl
              .super__Vector_impl_data._M_start[lVar10].parent;
      lVar15 = lVar10;
      while (iVar6 != -1) {
        local_8c = iVar6 - this->osz_;
        if ((_Bit_type *)local_88._8_8_ == local_78) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_88,(iterator)local_88._8_8_,
                     &local_8c);
        }
        else {
          *(int *)local_88._8_8_ = local_8c;
          local_88._8_8_ = (int *)(local_88._8_8_ + 4);
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (&local_58,
                   (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar15].binary);
        pNVar2 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)pNVar2[lVar15].parent;
        iVar6 = pNVar2[lVar15].parent;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(local_60,(vector<int,_std::allocator<int>_> *)local_88);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(local_68,&local_58);
      if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if ((_Bit_type *)local_88._0_8_ != (_Bit_type *)0x0) {
        operator_delete((void *)local_88._0_8_);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->osz_);
  }
  return;
}

Assistant:

void Model::buildTree(const std::vector<int64_t>& counts) {
	tree.resize(2 * osz_ - 1);
	for (int32_t i = 0; i < 2 * osz_ - 1; i++) {
		tree[i].parent = -1;
		tree[i].left = -1;
		tree[i].right = -1;
		tree[i].count = 1e15;
		tree[i].binary = false;
	}
	for (int32_t i = 0; i < osz_; i++) {
		tree[i].count = counts[i];
	}
	int32_t leaf = osz_ - 1;
	int32_t node = osz_;
	for (int32_t i = osz_; i < 2 * osz_ - 1; i++) {
		int32_t mini[2];
		for (int32_t j = 0; j < 2; j++) {
			if (leaf >= 0 && tree[leaf].count < tree[node].count) {
				mini[j] = leaf--;
			} else {
				mini[j] = node++;
			}
		}
		tree[i].left = mini[0];
		tree[i].right = mini[1];
		tree[i].count = tree[mini[0]].count + tree[mini[1]].count;
		tree[mini[0]].parent = i;
		tree[mini[1]].parent = i;
		tree[mini[1]].binary = true;
	}
	for (int32_t i = 0; i < osz_; i++) {
		std::vector<int32_t> path;
		std::vector<bool> code;
		int32_t j = i;
		while (tree[j].parent != -1) {
			path.push_back(tree[j].parent - osz_);
			code.push_back(tree[j].binary);
			j = tree[j].parent;
		}
		paths.push_back(path);
		codes.push_back(code);
	}
}